

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string_conv * get_sconv_object(archive *a,char *fc,char *tc,wchar_t flag)

{
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  archive *in_RDI;
  uint current_codepage;
  archive_string_conv *sc;
  wchar_t in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  archive *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  archive_string_conv *local_8;
  
  local_8 = find_sconv_object(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  if (local_8 == (archive_string_conv *)0x0) {
    if (in_RDI == (archive *)0x0) {
      get_current_codepage();
    }
    canonical_charset_name((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    canonical_charset_name((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    local_8 = create_sconv_object((char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (local_8 == (archive_string_conv *)0x0) {
      if (in_RDI != (archive *)0x0) {
        archive_set_error(in_RDI,0xc,"Could not allocate memory for a string conversion object");
      }
      local_8 = (archive_string_conv *)0x0;
    }
    else if (local_8->nconverter == L'\0') {
      if (in_RDI != (archive *)0x0) {
        if ((in_ECX & 1) != 0) {
          in_RSI = in_RDX;
        }
        archive_set_error(in_RDI,-1,"iconv_open failed : Cannot handle ``%s\'\'",in_RSI);
      }
      free_sconv_object((archive_string_conv *)0x27c905);
      local_8 = (archive_string_conv *)0x0;
    }
    else if (in_RDI != (archive *)0x0) {
      add_sconv_object(in_RDI,local_8);
    }
  }
  return local_8;
}

Assistant:

static struct archive_string_conv *
get_sconv_object(struct archive *a, const char *fc, const char *tc, int flag)
{
	struct archive_string_conv *sc;
	unsigned current_codepage;

	/* Check if we have made the sconv object. */
	sc = find_sconv_object(a, fc, tc);
	if (sc != NULL)
		return (sc);

	if (a == NULL)
		current_codepage = get_current_codepage();
	else
		current_codepage = a->current_codepage;

	sc = create_sconv_object(canonical_charset_name(fc),
	    canonical_charset_name(tc), current_codepage, flag);
	if (sc == NULL) {
		if (a != NULL)
			archive_set_error(a, ENOMEM,
			    "Could not allocate memory for "
			    "a string conversion object");
		return (NULL);
	}

	/*
	 * If there is no converter for current string conversion object,
	 * we cannot handle this conversion.
	 */
	if (sc->nconverter == 0) {
		if (a != NULL) {
#if HAVE_ICONV
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "iconv_open failed : Cannot handle ``%s''",
			    (flag & SCONV_TO_CHARSET)?tc:fc);
#else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "A character-set conversion not fully supported "
			    "on this platform");
#endif
		}
		/* Failed; free a sconv object. */
		free_sconv_object(sc);
		return (NULL);
	}

	/*
	 * Success!
	 */
	if (a != NULL)
		add_sconv_object(a, sc);
	return (sc);
}